

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O2

uint zvgDetectECP(uint portAdr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  undefined2 uStack_1c;
  
  ZvgIO.ecpDsr = portAdr + 1;
  ZvgIO.ecpDcr = portAdr + 2;
  ZvgIO.ecpEcr = portAdr + 0x402;
  ZvgIO.ecpFlags = 0;
  ZvgIO.ecpPort = portAdr;
  ZvgIO.ecpData = portAdr;
  ZvgIO.ecpEcpDFifo = portAdr + 0x400;
  iVar3 = iopl(3);
  if (iVar3 == 0) {
    uStack_1c = (undefined2)(portAdr + 0x400);
    bVar1 = in((undefined2)ZvgIO.ecpEcr);
    uVar4 = 8;
    if ((bVar1 & 3) == 1) {
      out((undefined2)ZvgIO.ecpEcr,0x34);
      cVar2 = in((undefined2)ZvgIO.ecpEcr);
      if (cVar2 == '5') {
        out((undefined2)ZvgIO.ecpEcr,0xf4);
        bVar1 = in(uStack_1c);
        in((short)portAdr + 0x401);
        bVar5 = bVar1 & 0x8f | 0x10;
        out(uStack_1c,bVar5);
        bVar1 = in(uStack_1c);
        uVar4 = 0x11;
        if (bVar1 == bVar5) {
          uVar4 = 0;
        }
        out((undefined2)ZvgIO.ecpEcr,0x14);
        ZvgIO.ecpDcrState = '\f';
        out((undefined2)ZvgIO.ecpDcr,0xc);
      }
    }
  }
  else {
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

uint zvgDetectECP( uint portAdr)
{
	uchar		pv, cnfgA, cnfgB;
	uint		err;

	err = errOk;

	// setup port addresses

	ZvgIO.ecpPort = portAdr;
	ZvgIO.ecpData = portAdr + ECP_data;
	ZvgIO.ecpDcr = portAdr + ECP_dcr;
	ZvgIO.ecpDsr = portAdr + ECP_dsr;
	ZvgIO.ecpEcr = portAdr + ECP_ecr;
	ZvgIO.ecpEcpDFifo = portAdr + ECP_ecpDFifo;

	// Reset all ECP flags

	ZvgIO.ecpFlags = 0;

	// Claim port access
	err = iopl(3);
	if (err)
	{
		return(1);
	}
	// look for ECP port

	pv = inportb( ZvgIO.ecpEcr);

	// Check that the full bit is off, and the empty bit is set

	if (!((pv & (ECR_full | ECR_empty)) == ECR_empty))
		return (errNotEcp);

	// verify that we cannot change the empty bit to a zero 

	outportb( ZvgIO.ecpEcr, 0x34);				// write 0x34

	if (inportb( ZvgIO.ecpEcr) != 0x35)			// verify 0x35 is read back
		return (errNotEcp);

	// gain access to the configuration registers

	outportb( ZvgIO.ecpEcr, ECR_Cnfg_mode | ECR_nErrIntrEn | ECR_serviceIntr);

	// read the configuration registers

	cnfgA = inportb( portAdr + ECP_cnfgA);
	cnfgB = inportb( portAdr + ECP_cnfgB);

	// Check the size of the data word being transferred

	if ((cnfgA & 0x60) != 0x10)
	{
		// if not set to 8 bit mode, try to set it

		cnfgA &= 0x9F;												// remove word size bits
		cnfgA |= 0x10;												// set to 8 bit words

		outportb( portAdr + ECP_cnfgA, cnfgA);

		// if not writeable, error

		if (inportb( portAdr + ECP_cnfgA) != cnfgA)
			err = errEcpWord;
	}

	// set port to SPP mode

	outportb( ZvgIO.ecpEcr, ECR_SPP_mode | ECR_nErrIntrEn | ECR_serviceIntr);

	// Set the flags to compatibility mode:
	//
	//    nSelectIn - Low
	//    nAutoFeed - High
	//    nStrobe   - High
	//    nInit     - High
	//
	// Also set are:
	//
	//    Direction - Low (buffers are enabled for writing to peripheral)
	//    ackIntEn  - Low (nAck interrupts are disabled)

	wdcr( DCR_nAutoFeed | DCR_nStrobe | DCR_nInit);

	return (err);
}